

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlRemoveID(xmlDocPtr doc,xmlAttrPtr attr)

{
  xmlHashTablePtr table_00;
  xmlChar *name;
  void *pvVar1;
  xmlChar *ID;
  xmlIDPtr id;
  xmlIDTablePtr table;
  xmlAttrPtr attr_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else if (attr == (xmlAttrPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else {
    table_00 = (xmlHashTablePtr)doc->ids;
    if (table_00 == (xmlHashTablePtr)0x0) {
      doc_local._4_4_ = -1;
    }
    else {
      name = xmlNodeListGetString(doc,attr->children,1);
      if (name == (xmlChar *)0x0) {
        doc_local._4_4_ = -1;
      }
      else {
        pvVar1 = xmlHashLookup(table_00,name);
        if ((pvVar1 == (void *)0x0) || (*(xmlAttrPtr *)((long)pvVar1 + 0x10) != attr)) {
          (*xmlFree)(name);
          doc_local._4_4_ = -1;
        }
        else {
          xmlHashRemoveEntry(table_00,name,xmlFreeIDTableEntry);
          (*xmlFree)(name);
          attr->atype = 0;
          doc_local._4_4_ = 0;
        }
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlRemoveID(xmlDocPtr doc, xmlAttrPtr attr) {
    xmlIDTablePtr table;
    xmlIDPtr id;
    xmlChar *ID;

    if (doc == NULL) return(-1);
    if (attr == NULL) return(-1);

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(-1);

    ID = xmlNodeListGetString(doc, attr->children, 1);
    if (ID == NULL)
        return(-1);

    id = xmlHashLookup(table, ID);
    if (id == NULL || id->attr != attr) {
        xmlFree(ID);
        return(-1);
    }

    xmlHashRemoveEntry(table, ID, xmlFreeIDTableEntry);
    xmlFree(ID);
    attr->atype = 0;
    return(0);
}